

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O0

char * LZ4_slideInputBuffer(void *LZ4_Data)

{
  int iVar1;
  char *in_RDI;
  int dictSize;
  LZ4_stream_t *unaff_retaddr;
  LZ4_stream_t_internal *ctx;
  
  iVar1 = LZ4_saveDict(unaff_retaddr,in_RDI,(int)((ulong)in_RDI >> 0x20));
  return (char *)(*(long *)(in_RDI + 0x4010) + (long)iVar1);
}

Assistant:

char* LZ4_slideInputBuffer (void* LZ4_Data)
{
    LZ4_stream_t_internal* ctx = (LZ4_stream_t_internal*)LZ4_Data;
    int dictSize = LZ4_saveDict((LZ4_stream_t*)LZ4_Data, (char*)ctx->bufferStart, 64 KB);
    return (char*)(ctx->bufferStart + dictSize);
}